

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.h
# Opt level: O0

int __thiscall ImageInput::close(ImageInput *this,int __fd)

{
  pointer pbVar1;
  ulong uVar2;
  pointer this_00;
  
  this_00 = (pointer)this->isp;
  pbVar1 = Imageio::std::
           unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00);
  if (this_00 == pbVar1) {
    Imageio::std::
    unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reset((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00,(pointer)this);
  }
  else {
    uVar2 = std::ifstream::is_open();
    if ((uVar2 & 1) != 0) {
      std::ifstream::close();
    }
  }
  this->isp = (istream *)0x0;
  return (int)this;
}

Assistant:

virtual void close() {
        if (isp == buffer.get()) {
            buffer.reset();
        } else if (file.is_open()) {
            file.close();
        }
        isp = nullptr;
    }